

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void update_bw_palette_rgba(Emulator *e,PaletteType type)

{
  int i;
  long lVar1;
  PaletteRGBA *pPVar2;
  int pal;
  int i_1;
  long lVar3;
  
  lVar1 = 0;
  do {
    e->pal[type].color[lVar1] = e->color_to_rgba[type].color[(e->state).ppu.pal[type].color[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  if (type == PALETTE_TYPE_BGP) {
    pPVar2 = e->sgb_pal;
    lVar1 = 0;
    do {
      lVar3 = 0;
      do {
        pPVar2->color[lVar3] =
             (e->state).sgb.screen_pal[lVar1].color[(e->state).ppu.pal[0].color[lVar3]];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      lVar1 = lVar1 + 1;
      pPVar2 = pPVar2 + 1;
    } while (lVar1 != 4);
  }
  return;
}

Assistant:

static void update_bw_palette_rgba(Emulator* e, PaletteType type) {
  for (int i = 0; i < 4; ++i) {
    e->pal[type].color[i] =
        e->color_to_rgba[type].color[PPU.pal[type].color[i]];
  }
  if (type == PALETTE_TYPE_BGP) {
    for (int pal = 0; pal < 4; ++pal) {
      for (int i = 0; i < 4; ++i) {
        e->sgb_pal[pal].color[i] =
            SGB.screen_pal[pal].color[PPU.pal[PALETTE_TYPE_BGP].color[i]];
      }
    }
  }
}